

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRboStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_1::RboComponentSizeColorCase::test
          (RboComponentSizeColorCase *this)

{
  int local_5c;
  GLenum local_58;
  int ndx;
  ColorFormat requiredColorFormats [3];
  GLuint local_14;
  RboComponentSizeColorCase *pRStack_10;
  GLuint renderbufferID;
  RboComponentSizeColorCase *this_local;
  
  local_14 = 0;
  pRStack_10 = this;
  glu::CallLogWrapper::glGenRenderbuffers(&(this->super_ApiCase).super_CallLogWrapper,1,&local_14);
  glu::CallLogWrapper::glBindRenderbuffer
            (&(this->super_ApiCase).super_CallLogWrapper,0x8d41,local_14);
  ApiCase::expectError(&this->super_ApiCase,0);
  checkRenderbufferComponentSize
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             &(this->super_ApiCase).super_CallLogWrapper,0,0,0,0,0,0);
  ApiCase::expectError(&this->super_ApiCase,0);
  memcpy(&local_58,&DAT_00ad96d0,0x3c);
  for (local_5c = 0; local_5c < 3; local_5c = local_5c + 1) {
    glu::CallLogWrapper::glRenderbufferStorage
              (&(this->super_ApiCase).super_CallLogWrapper,0x8d41,(&local_58)[(long)local_5c * 5],1,
               1);
    ApiCase::expectError(&this->super_ApiCase,0);
    checkRenderbufferComponentSize
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               &(this->super_ApiCase).super_CallLogWrapper,
               requiredColorFormats[(long)local_5c + -1].bitsA,
               requiredColorFormats[local_5c].internalFormat,requiredColorFormats[local_5c].bitsR,
               requiredColorFormats[local_5c].bitsG,-1,-1);
  }
  glu::CallLogWrapper::glDeleteRenderbuffers
            (&(this->super_ApiCase).super_CallLogWrapper,1,&local_14);
  return;
}

Assistant:

void test (void)
	{
		GLuint renderbufferID = 0;
		glGenRenderbuffers(1, &renderbufferID);
		glBindRenderbuffer(GL_RENDERBUFFER, renderbufferID);
		expectError(GL_NO_ERROR);

		checkRenderbufferComponentSize(m_testCtx, *this, 0, 0, 0, 0, 0, 0);
		expectError(GL_NO_ERROR);

		const struct ColorFormat
		{
			GLenum	internalFormat;
			int		bitsR, bitsG, bitsB, bitsA;
		} requiredColorFormats[] =
		{
			{ GL_RGBA4,			4,	4,	4,	4	},
			{ GL_RGB5_A1,		5,	5,	5,	1	},
			{ GL_RGB565,		5,	6,	5,	0	},
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(requiredColorFormats); ++ndx)
		{
			glRenderbufferStorage(GL_RENDERBUFFER, requiredColorFormats[ndx].internalFormat, 1, 1);
			expectError(GL_NO_ERROR);

			checkRenderbufferComponentSize(m_testCtx, *this, requiredColorFormats[ndx].bitsR, requiredColorFormats[ndx].bitsG, requiredColorFormats[ndx].bitsB, requiredColorFormats[ndx].bitsA, -1, -1);
		}

		glDeleteRenderbuffers(1, &renderbufferID);
	}